

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  char *pcVar2;
  size_t sVar3;
  char *__ptr;
  char *filename_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long *plVar11;
  undefined8 uVar12;
  ulong uVar13;
  char *pcVar14;
  xmlChar *result;
  char *nslist;
  int local_448;
  int local_444;
  char *local_440;
  char *local_438;
  int local_42c;
  char buf [500];
  char prefix [500];
  
  local_448 = mode;
  local_444 = with_comments;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  sVar3 = (size_t)((int)sVar3 + -4);
  memcpy(prefix,pcVar2,sVar3);
  prefix[sVar3] = '\0';
  iVar1 = snprintf(buf,499,"result/c14n/%s/%s",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  pcVar2 = strdup(buf);
  iVar1 = snprintf(buf,499,"test/c14n/%s/%s.xpath",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  iVar1 = checkTestFile(buf);
  if (iVar1 == 0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = strdup(buf);
  }
  iVar1 = snprintf(buf,499,"test/c14n/%s/%s.ns",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  iVar1 = checkTestFile(buf);
  if (iVar1 == 0) {
    filename_00 = (char *)0x0;
  }
  else {
    filename_00 = strdup(buf);
  }
  nb_tests = nb_tests + 1;
  result = (xmlChar *)0x0;
  nslist = (char *)0x0;
  lVar4 = xmlReadFile(filename,0,0x4a);
  if (lVar4 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
  }
  else {
    lVar5 = xmlDocGetRootElement(lVar4);
    if (lVar5 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
      goto LAB_0010e556;
    }
    local_440 = filename;
    if (__ptr != (char *)0x0) {
      lVar5 = xmlReadFile(__ptr,0,10);
      if (lVar5 == 0) {
        fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
      }
      else {
        lVar6 = xmlDocGetRootElement(lVar5);
        if (lVar6 == 0) {
          fprintf(_stderr,"Error: empty document for file \"%s\"\n",__ptr);
          xmlFreeDoc(lVar5);
        }
        else {
          plVar11 = (long *)(lVar5 + 0x18);
          while (lVar6 = *plVar11, lVar6 != 0) {
            iVar1 = xmlStrEqual(*(undefined8 *)(lVar6 + 0x10),"XPath");
            if (iVar1 != 0) {
              lVar7 = xmlNodeGetContent(lVar6);
              if (lVar7 == 0) {
                fprintf(_stderr,"Error: XPath content element is NULL \"%s\"\n",__ptr);
                goto LAB_0010e525;
              }
              lVar8 = xmlXPathNewContext(lVar4);
              if (lVar8 == 0) {
                fwrite("Error: unable to create new context\n",0x24,1,_stderr);
                (*_xmlFree)(lVar7);
                goto LAB_0010e525;
              }
              plVar11 = (long *)(lVar6 + 0x60);
              goto LAB_0010e235;
            }
            plVar11 = (long *)(lVar6 + 0x30);
          }
          fprintf(_stderr,"Error: XPath element expected in the file  \"%s\"\n",__ptr);
          xmlFreeDoc(lVar5);
        }
      }
      goto LAB_0010e53a;
    }
    lVar6 = 0;
LAB_0010e2bb:
    local_438 = __ptr;
    if (filename_00 == (char *)0x0) {
      puVar10 = (undefined8 *)0x0;
    }
    else {
      iVar1 = loadMem(filename_00,&nslist,&local_42c);
      pcVar14 = nslist;
      if (iVar1 != 0) {
        fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
        if (lVar6 != 0) {
          xmlXPathFreeObject(lVar6);
        }
        goto LAB_0010e556;
      }
      if (nslist != (char *)0x0) {
        iVar1 = xmlStrlen(nslist);
        if ((*pcVar14 == '\'') && (pcVar14[(long)iVar1 + -1] == '\'')) {
          pcVar14[(long)iVar1 + -1] = '\0';
          pcVar14 = pcVar14 + 1;
        }
        puVar9 = (undefined8 *)(*_xmlMalloc)(8000);
        if (puVar9 != (undefined8 *)0x0) {
          iVar1 = 1000;
          puVar10 = puVar9;
LAB_0010e348:
          if (*pcVar14 != '\0') {
            uVar13 = (long)puVar9 - (long)puVar10;
            if ((long)(iVar1 + -10) < (long)uVar13 >> 3) {
              iVar1 = iVar1 * 2;
              puVar10 = (undefined8 *)(*_xmlRealloc)(puVar10,(long)iVar1 << 3);
              if (puVar10 == (undefined8 *)0x0) {
                perror("realloc failed");
                puVar10 = (undefined8 *)0x0;
                goto LAB_0010e576;
              }
              puVar9 = puVar10 + (int)(uVar13 >> 3);
            }
            *puVar9 = pcVar14;
            puVar9 = puVar9 + 1;
            for (; *pcVar14 != '\0'; pcVar14 = pcVar14 + 1) {
              if (*pcVar14 == ',') {
                *pcVar14 = '\0';
                pcVar14 = pcVar14 + 1;
                break;
              }
            }
            goto LAB_0010e348;
          }
          *puVar9 = 0;
          goto LAB_0010e576;
        }
        perror("malloc failed");
      }
      puVar10 = (undefined8 *)0x0;
    }
LAB_0010e576:
    if (lVar6 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)(lVar6 + 8);
    }
    size = xmlC14NDocDumpMemory(lVar4,uVar12,local_448,puVar10,local_444,&result);
    if ((int)size < 0) {
      fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",local_440,
              (ulong)size);
LAB_0010e69a:
      size = 0xffffffff;
LAB_0010e5c7:
      if (result != (xmlChar *)0x0) {
        (*_xmlFree)();
      }
    }
    else if (result != (xmlChar *)0x0) {
      iVar1 = compareFileMem(pcVar2,(char *)result,size);
      if (iVar1 != 0) {
        fprintf(_stderr,"Result mismatch for %s\n",local_440);
        fprintf(_stderr,"RESULT:\n%s\n",result);
        goto LAB_0010e69a;
      }
      goto LAB_0010e5c7;
    }
    if (lVar6 != 0) {
      xmlXPathFreeObject(lVar6);
    }
    if (puVar10 != (undefined8 *)0x0) {
      (*_xmlFree)(puVar10);
    }
    free(nslist);
    xmlFreeDoc(lVar4);
    iVar1 = 0;
    __ptr = local_438;
    if (-1 < (int)size) goto LAB_0010e619;
  }
  goto LAB_0010e616;
  while (iVar1 = xmlXPathRegisterNs(lVar8,plVar11[3],plVar11[2]), iVar1 == 0) {
LAB_0010e235:
    plVar11 = (long *)*plVar11;
    if (plVar11 == (long *)0x0) {
      lVar6 = xmlXPathEvalExpression(lVar7,lVar8);
      if (lVar6 == 0) {
        fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
        goto LAB_0010e511;
      }
      (*_xmlFree)(lVar7);
      xmlXPathFreeContext(lVar8);
      xmlFreeDoc(lVar5);
      goto LAB_0010e2bb;
    }
  }
  fprintf(_stderr,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",plVar11[3],
          plVar11[2]);
LAB_0010e511:
  (*_xmlFree)(lVar7);
  xmlXPathFreeContext(lVar8);
LAB_0010e525:
  xmlFreeDoc(lVar5);
LAB_0010e53a:
  fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
LAB_0010e556:
  xmlFreeDoc(lVar4);
LAB_0010e616:
  iVar1 = 1;
LAB_0010e619:
  free(pcVar2);
  free(__ptr);
  free(filename_00);
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}